

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidScale(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  WeightParams *pWVar4;
  ostream *poVar5;
  Result local_b8;
  int i_1;
  int num_bias;
  int i;
  int num_channel;
  ScaleLayerParams *params;
  NeuralNetworkLayer *scaleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  scaleLayer = (NeuralNetworkLayer *)
               CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  params = (ScaleLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)scaleLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  _i = CoreML::Specification::NeuralNetworkLayer::mutable_scale((NeuralNetworkLayer *)params);
  num_bias = 5;
  CoreML::Specification::ScaleLayerParams::add_shapescale(_i,5);
  for (i_1 = 0; i_1 < num_bias; i_1 = i_1 + 1) {
    pWVar4 = CoreML::Specification::ScaleLayerParams::mutable_scale(_i);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar4,1.0);
  }
  local_b8.m_message._M_storage._M_storage[4] = '\x03';
  local_b8.m_message._M_storage._M_storage[5] = '\0';
  local_b8.m_message._M_storage._M_storage[6] = '\0';
  local_b8.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Specification::ScaleLayerParams::add_shapebias(_i,3);
  CoreML::Specification::ScaleLayerParams::set_hasbias(_i,true);
  local_b8.m_message._M_storage._M_storage[0] = '\0';
  local_b8.m_message._M_storage._M_storage[1] = '\0';
  local_b8.m_message._M_storage._M_storage[2] = '\0';
  local_b8.m_message._M_storage._M_storage[3] = '\0';
  for (; (int)local_b8.m_message._M_storage._M_storage._0_4_ <
         (int)local_b8.m_message._M_storage._M_storage._4_4_;
      local_b8.m_message._M_storage._M_storage._0_4_ =
           local_b8.m_message._M_storage._M_storage._0_4_ + 1) {
    pWVar4 = CoreML::Specification::ScaleLayerParams::mutable_bias(_i);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar4,1.0);
  }
  CoreML::validate<(MLModelType)500>(&local_b8,(Model *)&topIn);
  bVar1 = CoreML::Result::good(&local_b8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd79);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"(res).good()");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result(&local_b8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidScale() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    params->add_shapebias(num_bias);
    params->set_hasbias(true);
    for (int i = 0; i < num_bias; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}